

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

byte * __thiscall
Js::ByteCodeBufferReader::ReadFunctionBodyHeader
          (ByteCodeBufferReader *this,byte *functionBytes,int *displayNameId,int *lineNumber,
          int *columnNumber,uint *bitflags)

{
  byte *local_48;
  byte *current;
  SerializedFieldList *definedFields;
  uint *bitflags_local;
  int *columnNumber_local;
  int *lineNumber_local;
  int *displayNameId_local;
  byte *functionBytes_local;
  ByteCodeBufferReader *this_local;
  
  local_48 = functionBytes + 8;
  if ((*(ulong *)functionBytes >> 0x30 & 1) == 0) {
    *lineNumber = 0;
  }
  else {
    local_48 = ReadInt32(this,local_48,lineNumber);
  }
  if ((*(ulong *)functionBytes >> 0x31 & 1) == 0) {
    *columnNumber = 0;
  }
  else {
    local_48 = ReadInt32(this,local_48,columnNumber);
  }
  local_48 = ReadConstantSizedUInt32(this,local_48,bitflags);
  if ((*bitflags & 0x100000) == 0) {
    local_48 = ReadInt32(this,local_48,displayNameId);
  }
  else {
    *displayNameId = -1;
  }
  return local_48;
}

Assistant:

const byte * ReadFunctionBodyHeader(const byte * functionBytes, int& displayNameId, int& lineNumber, int& columnNumber, unsigned int& bitflags)
    {
        serialization_alignment SerializedFieldList* definedFields = (serialization_alignment SerializedFieldList*) functionBytes;

        // Basic function body constructor arguments
        const byte * current = functionBytes + sizeof(serialization_alignment SerializedFieldList);
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int constant;
        current = ReadInt32(current, &constant);
        Assert(constant == magicStartOfFunctionBody);
#endif
        if (definedFields->has_m_lineNumber)
        {
            current = ReadInt32(current, &lineNumber);
        }
        else
        {
            lineNumber = 0;
        }

        if (definedFields->has_m_columnNumber)
        {
            current = ReadInt32(current, &columnNumber);
        }
        else
        {
            columnNumber = 0;
        }

        current = ReadConstantSizedUInt32(current, &bitflags);

        if (bitflags & ffIsAnonymous)
        {
            displayNameId = -1;
        }
        else
        {
            current = ReadInt32(current, &displayNameId);
        }
        return current;
    }